

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O3

double __thiscall
VarianceSwapsHestonAnalyticalPricer::u1Term
          (VarianceSwapsHestonAnalyticalPricer *this,double t1,double t2)

{
  double dVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  complex<double> __r;
  complex<double> D1;
  complex<double> C1;
  undefined1 local_68 [16];
  double local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  complex<double> local_38;
  undefined1 local_28 [16];
  
  dVar2 = t2 - t1;
  dVar1 = HestonModel::getInitialVolatility(this->hestonModel_);
  dVar3 = 0.0;
  uVar4 = 0;
  functionCPrime(this,dVar2,0.0);
  local_28._4_4_ = extraout_XMM0_Db;
  local_28._0_4_ = extraout_XMM0_Da;
  local_58 = dVar3;
  uStack_50 = uVar4;
  local_48 = extraout_XMM0_Da;
  uStack_44 = extraout_XMM0_Db;
  local_28._8_8_ = dVar3;
  functionCSecond(this,dVar2,0.0);
  uVar4 = 0;
  functionDPrime(this,dVar2,0.0);
  local_38._M_value._4_4_ = extraout_XMM0_Db_01;
  local_38._M_value._0_4_ = extraout_XMM0_Da_01;
  local_38._M_value._8_8_ = uVar4;
  functionDSecond(this,dVar2,0.0);
  local_68._8_8_ = local_38._M_value._8_8_;
  local_68._0_8_ = local_38._M_value._0_8_;
  std::complex<double>::operator*=((complex<double> *)local_68,&local_38);
  dVar3 = (double)local_68._0_8_ * dVar1;
  local_68._8_4_ = SUB84(local_58 + local_58,0);
  local_68._0_8_ = (double)CONCAT44(uStack_44,local_48) + (double)CONCAT44(uStack_44,local_48);
  local_68._12_4_ = (int)((ulong)(local_58 + local_58) >> 0x20);
  std::complex<double>::operator*=((complex<double> *)local_68,&local_38);
  dVar2 = (double)local_68._0_8_ - (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
  local_68._8_8_ = local_28._8_8_;
  local_68._0_8_ = local_28._0_8_;
  std::complex<double>::operator*=((complex<double> *)local_68,(complex<double> *)local_28);
  return ((double)local_68._0_8_ - (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00)) +
         dVar2 * dVar1 + dVar3 * dVar1;
}

Assistant:

double VarianceSwapsHestonAnalyticalPricer::
u1Term(double t1, double t2) const {
    double delta = t2-t1,
           v0 = hestonModel_->getInitialVolatility();
    std::complex<double> C1 = functionCPrime(delta,0.),
                        C2 = functionCSecond(delta,0.),
                        D1 = functionDPrime(delta,0.),
                        D2 = functionDSecond(delta,0.);
    std::complex<double> firstTerm = D1*D1*v0*v0,
                        secondTerm = v0*(2.0*C1*D1-D2),
                        thirdTerm = C1*C1 - C2;
    std::complex<double> u1 = firstTerm+secondTerm+thirdTerm; 
    return u1.real();
}